

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void Cmd_texture_browse(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  FTextureID FVar2;
  char *pcVar3;
  UCVarValue value;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar3 = FCommandLine::operator[](argv,1);
    FVar2 = FTextureManager::CheckForTexture(&TexMan,pcVar3,0,1);
    if (FVar2.texnum == -1) {
      pcVar3 = FCommandLine::operator[](argv,1);
      Printf("Texture %s not found\n",pcVar3);
    }
    value._4_4_ = 0;
    value.Int = FVar2.texnum;
    FBaseCVar::SetGenericRep(&texture_browse_index.super_FBaseCVar,value,CVAR_Int);
    return;
  }
  Printf("Usage: texture_browse <name>\n");
  return;
}

Assistant:

CCMD(texture_browse)
{
	if (argv.argc() > 1)
	{
		const int index = TexMan.CheckForTexture(argv[1], FTexture::TEX_Any).GetIndex();

		if (-1 == index)
		{
			Printf("Texture %s not found\n", argv[1]);
		}

		texture_browse_index = index;
	}
	else
	{
		Printf("Usage: texture_browse <name>\n");
	}
}